

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O0

void __thiscall
cnn::InputNode::InputNode(InputNode *this,Dim *d,vector<float,_std::allocator<float>_> *dat)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  Node *in_stack_ffffffffffffffe0;
  
  Node::Node(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__InputNode_005f8698;
  *(undefined4 *)(in_RDI + 0xe) = *(undefined4 *)(in_RSI + 4);
  uVar1 = in_RSI[1];
  uVar2 = in_RSI[2];
  uVar3 = in_RSI[3];
  in_RDI[10] = *in_RSI;
  in_RDI[0xb] = uVar1;
  in_RDI[0xc] = uVar2;
  in_RDI[0xd] = uVar3;
  std::vector<float,_std::allocator<float>_>::vector(dat,in_stack_00000018);
  in_RDI[0x12] = in_RDI + 0xf;
  return;
}

Assistant:

explicit InputNode(const Dim& d, const std::vector<float>& dat) : dim(d), data(dat), pdata(&data) {}